

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

void json11::dump(string *value,string *out)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  char buf [8];
  char acStack_38 [8];
  
  cVar2 = (char)out;
  std::__cxx11::string::push_back(cVar2);
  if (value->_M_string_length != 0) {
    uVar3 = 0;
    do {
      bVar1 = (value->_M_dataplus)._M_p[uVar3];
      switch(bVar1) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      case 0xb:
switchD_00109635_caseD_b:
        if (bVar1 < 0x20) {
          snprintf(acStack_38,8,"\\u%04x");
          break;
        }
        std::__cxx11::string::push_back(cVar2);
        goto LAB_001096bd;
      case 0xc:
        break;
      case 0xd:
        break;
      default:
        if ((bVar1 != 0x22) && (bVar1 != 0x5c)) goto switchD_00109635_caseD_b;
      }
      std::__cxx11::string::append((char *)out);
LAB_001096bd:
      uVar3 = uVar3 + 1;
    } while (uVar3 < value->_M_string_length);
  }
  std::__cxx11::string::push_back(cVar2);
  return;
}

Assistant:

static void dump(const string &value, string &out) {
    out += '"';
    for (size_t i = 0; i < value.length(); i++) {
        const char ch = value[i];
        if (ch == '\\') {
            out += "\\\\";
        } else if (ch == '"') {
            out += "\\\"";
        } else if (ch == '\b') {
            out += "\\b";
        } else if (ch == '\f') {
            out += "\\f";
        } else if (ch == '\n') {
            out += "\\n";
        } else if (ch == '\r') {
            out += "\\r";
        } else if (ch == '\t') {
            out += "\\t";
        } else if (static_cast<uint8_t>(ch) <= 0x1f) {
            char buf[8];
            snprintf(buf, sizeof buf, "\\u%04x", ch);
            out += buf;
        } else if (static_cast<uint8_t>(ch) == 0xe2 && static_cast<uint8_t>(value[i+1]) == 0x80
                   && static_cast<uint8_t>(value[i+2]) == 0xa8) {
            out += "\\u2028";
            i += 2;
        } else if (static_cast<uint8_t>(ch) == 0xe2 && static_cast<uint8_t>(value[i+1]) == 0x80
                   && static_cast<uint8_t>(value[i+2]) == 0xa9) {
            out += "\\u2029";
            i += 2;
        } else {
            out += ch;
        }
    }
    out += '"';
}